

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O0

BOOL __thiscall Js::RecyclableObjectDisplay::HasChildren(RecyclableObjectDisplay *this)

{
  ScriptContext *scriptContext;
  code *pcVar1;
  anon_class_8_1_6424947d this_00;
  bool bVar2;
  BOOL BVar3;
  TypeId TVar4;
  undefined4 *puVar5;
  ThreadContext *this_01;
  void *unaff_retaddr;
  Var error;
  JavascriptException *err;
  EnterScriptObject __enterScriptObject;
  ScriptEntryExitRecord __entryExitRecord;
  ScriptContext *__localScriptContext;
  int local_34;
  anon_class_8_1_6424947d aStack_30;
  BOOL autoFuncReturn;
  anon_class_8_1_6424947d funcPtr;
  RecyclableObject *object;
  RecyclableObjectDisplay *this_local;
  TypeId typeId;
  
  bVar2 = VarIs<Js::RecyclableObject>(this->instance);
  if (bVar2) {
    funcPtr.object = (RecyclableObject **)VarTo<Js::RecyclableObject>(this->instance);
    BVar3 = Js::JavascriptOperators::IsObject((RecyclableObject *)funcPtr.object);
    this_00.object = funcPtr.object;
    if (BVar3 != 0) {
      if (funcPtr.object == (RecyclableObject **)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      TVar4 = RecyclableObject::GetTypeId((RecyclableObject *)this_00.object);
      if ((0x57 < (int)TVar4) &&
         (BVar3 = RecyclableObject::IsExternal((RecyclableObject *)this_00.object), BVar3 == 0)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      if (TVar4 == TypeIds_HostDispatch) {
        return 1;
      }
      aStack_30.object = (RecyclableObject **)&funcPtr;
      this_01 = ScriptContext::GetThreadContext(this->scriptContext);
      bVar2 = ThreadContext::IsScriptActive(this_01);
      if (bVar2) {
        local_34 = HasChildren::anon_class_8_1_6424947d::operator()(&stack0xffffffffffffffd0);
      }
      else {
        scriptContext = this->scriptContext;
        __enterScriptObject.library = (JavascriptLibrary *)0x0;
        EnterScriptObject::EnterScriptObject
                  ((EnterScriptObject *)&err,scriptContext,
                   (ScriptEntryExitRecord *)&__enterScriptObject.library,unaff_retaddr,
                   &stack0x00000000,false,false,false);
        ScriptContext::OnScriptStart(scriptContext,false,true);
        EnterScriptObject::VerifyEnterScript((EnterScriptObject *)&err);
        local_34 = HasChildren::anon_class_8_1_6424947d::operator()(&stack0xffffffffffffffd0);
        EnterScriptObject::~EnterScriptObject((EnterScriptObject *)&err);
      }
      if (local_34 == 1) {
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

BOOL RecyclableObjectDisplay::HasChildren()
    {
        if (Js::VarIs<Js::RecyclableObject>(instance))
        {
            Js::RecyclableObject* object = Js::VarTo<Js::RecyclableObject>(instance);

            if (JavascriptOperators::IsObject(object))
            {
                if (JavascriptOperators::GetTypeId(object) == TypeIds_HostDispatch)
                {
                    return TRUE;
                }

                try
                {
                    auto funcPtr = [&]()
                    {
                        IGNORE_STACKWALK_EXCEPTION(scriptContext);
                        if (object->IsExternal())
                        {
                            Js::ForInObjectEnumerator enumerator(object, object->GetScriptContext(), /* enumSymbols */ true);
                            Js::PropertyId propertyId;
                            if (enumerator.MoveAndGetNext(propertyId))
                            {
                                enumerator.Clear();
                                return TRUE;
                            }
                        }
                        else if (object->GetPropertyCount() > 0 || (JavascriptOperators::GetTypeId(object->GetPrototype()) != TypeIds_Null))
                        {
                            return TRUE;
                        }

                        return FALSE;
                    };

                    BOOL autoFuncReturn = FALSE;

                    if (!scriptContext->GetThreadContext()->IsScriptActive())
                    {
                        BEGIN_JS_RUNTIME_CALL_EX(scriptContext, false)
                        {
                            autoFuncReturn = funcPtr();
                        }
                        END_JS_RUNTIME_CALL(scriptContext);
                    }
                    else
                    {
                        autoFuncReturn = funcPtr();
                    }

                    if (autoFuncReturn == TRUE)
                    {
                        return TRUE;
                    }
                }
                catch (const JavascriptException& err)
                {
                    // The For in enumerator can throw an exception and we will use the error object as a child in that case.
                    Var error = err.GetAndClear()->GetThrownObject(scriptContext);
                    if (error != nullptr && Js::VarIs<Js::JavascriptError>(error))
                    {
                        return TRUE;
                    }
                    return FALSE;
                }
            }
        }

        return FALSE;
    }